

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O3

string * __thiscall
amrex::ForkJoin::get_io_filename_abi_cxx11_
          (string *__return_storage_ptr__,ForkJoin *this,bool flag_unique)

{
  pointer pcVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  undefined8 *puVar5;
  long *plVar6;
  bool bVar7;
  uint uVar8;
  long lVar9;
  long *plVar10;
  undefined7 in_register_00000011;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string __str_2;
  string result_base;
  long *local_330;
  undefined8 local_328;
  long local_320;
  undefined8 uStack_318;
  string *local_310;
  ulong *local_308;
  long local_300;
  ulong local_2f8 [2];
  vector<int,_std::allocator<int>_> local_2e8;
  undefined4 local_2c4;
  ulong *local_2c0;
  long local_2b8;
  ulong local_2b0 [2];
  long *local_2a0;
  long local_298;
  long local_290 [2];
  long *local_280 [2];
  long local_270 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  long *local_258;
  long local_250;
  long local_248 [2];
  long *local_238;
  long local_230;
  long local_228;
  long lStack_220;
  int aiStack_218 [20];
  ios_base local_1c8 [408];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_310 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"","");
  iVar3 = std::__cxx11::string::compare((char *)&this->task_output_dir);
  if (iVar3 != 0) {
    local_2c4 = (undefined4)CONCAT71(in_register_00000011,flag_unique);
    local_2a0 = local_290;
    pcVar1 = (this->task_output_dir)._M_dataplus._M_p;
    local_260 = &__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar1,pcVar1 + (this->task_output_dir)._M_string_length);
    local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    if (0x48 < DAT_0071a620 - ParallelContext::frames) {
      lVar14 = 1;
      lVar17 = 0x50;
      lVar15 = ParallelContext::frames;
      lVar9 = DAT_0071a620;
      do {
        local_238 = (long *)CONCAT44(local_238._4_4_,*(int *)(lVar15 + lVar17));
        if (local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_2e8,
                     (iterator)
                     local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_238);
          lVar15 = ParallelContext::frames;
          lVar9 = DAT_0071a620;
        }
        else {
          *local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = *(int *)(lVar15 + lVar17);
          local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        lVar14 = lVar14 + 1;
        lVar11 = (lVar9 - lVar15 >> 3) * -0x71c71c71c71c71c7;
        lVar17 = lVar17 + 0x48;
      } while (lVar11 - lVar14 != 0 && lVar14 <= lVar11);
    }
    local_258 = local_248;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"-","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    if (local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start &&
        -1 < (long)local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start) {
      bVar7 = true;
      lVar15 = 0;
      do {
        if (!bVar7) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_238,(char *)local_258,local_250);
        }
        std::ostream::operator<<
                  ((ostream *)&local_238,
                   local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar15]);
        lVar15 = lVar15 + 1;
        bVar7 = false;
      } while (lVar15 < (long)local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
    std::ios_base::~ios_base(local_1c8);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,0x677f7c);
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_320 = *plVar6;
      uStack_318 = puVar5[3];
      local_330 = &local_320;
    }
    else {
      local_320 = *plVar6;
      local_330 = (long *)*puVar5;
    }
    local_328 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_330);
    if (local_330 != &local_320) {
      operator_delete(local_330,local_320 + 1);
    }
    if (local_308 != local_2f8) {
      operator_delete(local_308,local_2f8[0] + 1);
    }
    if (local_258 != local_248) {
      operator_delete(local_258,local_248[0] + 1);
    }
    if (local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar18 = *(uint *)(DAT_0071a620 + -0x3c);
    uVar16 = -uVar18;
    if (0 < (int)uVar18) {
      uVar16 = uVar18;
    }
    uVar13 = 1;
    if (9 < uVar16) {
      uVar12 = (ulong)uVar16;
      uVar4 = 4;
      do {
        uVar13 = uVar4;
        uVar8 = (uint)uVar12;
        if (uVar8 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_0043ceeb;
        }
        if (uVar8 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_0043ceeb;
        }
        if (uVar8 < 10000) goto LAB_0043ceeb;
        uVar12 = uVar12 / 10000;
        uVar4 = uVar13 + 4;
      } while (99999 < uVar8);
      uVar13 = uVar13 + 1;
    }
LAB_0043ceeb:
    local_330 = &local_320;
    std::__cxx11::string::_M_construct((ulong)&local_330,(char)uVar13 - (char)((int)uVar18 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar18 >> 0x1f) + (long)local_330),uVar13,uVar16);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_330,0,(char *)0x0,0x677f80);
    uVar2 = local_2c4;
    local_238 = &local_228;
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_228 = *plVar10;
      lStack_220 = plVar6[3];
    }
    else {
      local_228 = *plVar10;
      local_238 = (long *)*plVar6;
    }
    local_230 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_238);
    if (local_238 != &local_228) {
      operator_delete(local_238,local_228 + 1);
    }
    if (local_330 != &local_320) {
      operator_delete(local_330,local_320 + 1);
    }
    if ((char)uVar2 == '\0') {
      local_238 = &local_228;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_2a0,local_298 + (long)local_2a0);
      std::__cxx11::string::append((char *)&local_238);
      std::__cxx11::string::operator=((string *)local_310,(string *)&local_238);
      if (local_238 != &local_228) {
        operator_delete(local_238,local_228 + 1);
      }
    }
    else {
      uVar18 = 0;
      do {
        local_308 = local_2f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_308,local_2a0,local_298 + (long)local_2a0);
        std::__cxx11::string::append((char *)&local_308);
        uVar16 = 1;
        if (9 < uVar18) {
          uVar12 = (ulong)uVar18;
          uVar13 = 4;
          do {
            uVar16 = uVar13;
            uVar4 = (uint)uVar12;
            if (uVar4 < 100) {
              uVar16 = uVar16 - 2;
              goto LAB_0043d093;
            }
            if (uVar4 < 1000) {
              uVar16 = uVar16 - 1;
              goto LAB_0043d093;
            }
            if (uVar4 < 10000) goto LAB_0043d093;
            uVar12 = uVar12 / 10000;
            uVar13 = uVar16 + 4;
          } while (99999 < uVar4);
          uVar16 = uVar16 + 1;
        }
LAB_0043d093:
        local_2c0 = local_2b0;
        std::__cxx11::string::_M_construct((ulong)&local_2c0,(char)uVar16);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_2c0,uVar16,uVar18);
        uVar12 = 0xf;
        if (local_308 != local_2f8) {
          uVar12 = local_2f8[0];
        }
        if (uVar12 < (ulong)(local_2b8 + local_300)) {
          uVar12 = 0xf;
          if (local_2c0 != local_2b0) {
            uVar12 = local_2b0[0];
          }
          if (uVar12 < (ulong)(local_2b8 + local_300)) goto LAB_0043d10a;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_308);
        }
        else {
LAB_0043d10a:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_2c0);
        }
        plVar6 = puVar5 + 2;
        if ((long *)*puVar5 == plVar6) {
          local_320 = *plVar6;
          uStack_318 = puVar5[3];
          local_330 = &local_320;
        }
        else {
          local_320 = *plVar6;
          local_330 = (long *)*puVar5;
        }
        local_328 = puVar5[1];
        *puVar5 = plVar6;
        puVar5[1] = 0;
        *(undefined1 *)plVar6 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_330);
        plVar10 = plVar6 + 2;
        if ((long *)*plVar6 == plVar10) {
          local_228 = *plVar10;
          lStack_220 = plVar6[3];
          local_238 = &local_228;
        }
        else {
          local_228 = *plVar10;
          local_238 = (long *)*plVar6;
        }
        local_230 = plVar6[1];
        *plVar6 = (long)plVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_310,(string *)&local_238);
        if (local_238 != &local_228) {
          operator_delete(local_238,local_228 + 1);
        }
        if (local_330 != &local_320) {
          operator_delete(local_330,local_320 + 1);
        }
        if (local_2c0 != local_2b0) {
          operator_delete(local_2c0,local_2b0[0] + 1);
        }
        if (local_308 != local_2f8) {
          operator_delete(local_308,local_2f8[0] + 1);
        }
        local_280[0] = local_270;
        pcVar1 = (local_310->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_280,pcVar1,pcVar1 + local_310->_M_string_length);
        std::ifstream::ifstream(&local_238,(string *)local_280,_S_in);
        iVar3 = *(int *)((long)aiStack_218 + local_238[-3]);
        std::ifstream::~ifstream(&local_238);
        if (local_280[0] != local_270) {
          operator_delete(local_280[0],local_270[0] + 1);
        }
        uVar18 = uVar18 + 1;
      } while (iVar3 == 0);
    }
    if (local_2a0 != local_290) {
      operator_delete(local_2a0,local_290[0] + 1);
    }
  }
  return local_310;
}

Assistant:

std::string
ForkJoin::get_io_filename (bool flag_unique)
{
    std::string result = "";

    if (task_output_dir != "") {
        // build base filename
        std::string result_base = task_output_dir;
        result_base += "/T-" + str_join(get_frame_id_vec(), "-");
        result_base += ".R-" + std::to_string(ParallelContext::MyProcSub());

        if (flag_unique) {
            // concatenate an integer to the end to make unique
            int i = 0;
            do {
                result = result_base + ".I-" + std::to_string(i++) + ".out";
            } while (file_exists(result));
        } else {
            result = result_base + ".out";
        }
    }

    return result;
}